

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

char (*) [2]
StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
          (char (*arg) [2],char *args,char (*args_1) [2],unsigned_long *args_2,char (*args_3) [2],
          char *args_4,char (*args_5) [2],unsigned_long *args_6,char (*args_7) [2],char *args_8)

{
  char *in_RCX;
  unsigned_long *unaff_RBX;
  char (*in_RDI) [2];
  char (*in_R8) [2];
  unsigned_long *in_R9;
  char (*unaff_retaddr) [2];
  char *in_stack_00000008;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  string local_58 [16];
  char *in_stack_ffffffffffffffb8;
  char (*in_stack_ffffffffffffffc0) [2];
  char (*args_4_00) [2];
  
  args_4_00 = in_RDI;
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff78);
  StringBuilder<char,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,args_4_00,
             unaff_RBX,unaff_retaddr,in_stack_00000008);
  std::operator+(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  std::__cxx11::string::~string(local_58);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}